

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtools.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* stringtools::split_with_delims
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,
            set<char,_std::less<char>,_std::allocator<char>_> *delims)

{
  ulong uVar1;
  bool bVar2;
  ulong __pos;
  ulong __pos_00;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __pos_00 = 0;
  do {
    lVar3 = 0;
    __pos = __pos_00;
    while( true ) {
      uVar1 = str->_M_string_length;
      if (uVar1 <= __pos) {
        if (__pos_00 <= uVar1 && uVar1 - __pos_00 != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_50,str,__pos_00,uVar1 - __pos_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        return __return_storage_ptr__;
      }
      bVar2 = std::set<char,_std::less<char>,_std::allocator<char>_>::contains
                        (delims,(str->_M_dataplus)._M_p + __pos);
      if (bVar2) break;
      __pos = __pos + 1;
      lVar3 = lVar3 + -1;
    }
    if (lVar3 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,str,__pos_00,-lVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,str,__pos,1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    __pos_00 = __pos + 1;
  } while( true );
}

Assistant:

inline std::vector<std::string> split_with_delims(const std::string& str, const std::set<char>& delims)
    {
        std::vector<std::string> tokens;
        size_t prev = 0;
        for(size_t pos = 0 ; pos < str.length() ; ++pos)
        {
            if(!delims.contains(str[pos]))
                continue;

            if(pos-prev > 0)
                tokens.emplace_back(str.substr(prev, pos-prev));
            tokens.emplace_back(str.substr(pos, 1));
            prev = pos + 1;
        }

        if(prev < str.length())
            tokens.emplace_back(str.substr(prev, str.length()-prev));

        return tokens;
    }